

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall TestRegenerateCmakeAddDependencies::Run(TestRegenerateCmakeAddDependencies *this)

{
  __type _Var1;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __lhs;
  runtime_error *this_00;
  undefined1 uVar2;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  __type v;
  ostringstream oss;
  string expectedOutput;
  Component comp;
  Component *in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0f;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb10;
  value_type *in_stack_fffffffffffffb18;
  path *in_stack_fffffffffffffb20;
  allocator *paVar4;
  string local_4b0 [24];
  path *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  ostringstream local_488 [383];
  allocator local_309;
  string local_308 [32];
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  allocator local_2d1;
  string local_2d0 [32];
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  allocator local_299;
  string local_298 [664];
  
  boost::filesystem::path::path(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  Component::Component
            ((Component *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb68);
  boost::filesystem::path::~path((path *)0x154439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"ComponentA",&local_299);
  pVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffffb10,
                   (value_type *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08));
  local_2b0 = (_Base_ptr)pVar3.first._M_node;
  local_2a8 = pVar3.second;
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  paVar4 = &local_2d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"ComponentB",paVar4);
  pVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffffb10,
                   (value_type *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08));
  __lhs = pVar3.first._M_node;
  uVar2 = pVar3.second;
  local_2e8 = __lhs._M_node;
  local_2e0 = uVar2;
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_308,"add_dependencies(${PROJECT_NAME}\n  ComponentA\n  ComponentB\n)\n\n",
             &local_309);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::__cxx11::ostringstream::ostringstream(local_488);
  RegenerateCmakeAddDependencies
            ((ostream *)__lhs._M_node,(Component *)CONCAT17(uVar2,in_stack_fffffffffffffb08));
  std::__cxx11::ostringstream::str();
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs._M_node,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar2,in_stack_fffffffffffffb08));
  std::__cxx11::string::~string(local_4b0);
  if (!_Var1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_488);
  std::__cxx11::string::~string(local_308);
  Component::~Component(in_stack_fffffffffffffaf0);
  return;
}

Assistant:

TEST(RegenerateCmakeAddDependencies) {
  Component comp("./MyComponent");
  comp.buildAfters.insert("ComponentA");
  comp.buildAfters.insert("ComponentB");

  const std::string expectedOutput(
      "add_dependencies(${PROJECT_NAME}\n"
      "  ComponentA\n"
      "  ComponentB\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeAddDependencies(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}